

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess-posix.cc
# Opt level: O2

bool __thiscall SubprocessSet::DoWork(SubprocessSet *this)

{
  uint uVar1;
  pointer ppSVar2;
  uint __i;
  int iVar3;
  long lVar4;
  pointer ppSVar5;
  iterator __position;
  int *piVar6;
  fd_set *__arr;
  fd_set set;
  
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    set.fds_bits[lVar4] = 0;
  }
  ppSVar2 = (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  iVar3 = 0;
  for (ppSVar5 = (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppSVar5 != ppSVar2; ppSVar5 = ppSVar5 + 1
      ) {
    uVar1 = (*ppSVar5)->fd_;
    if (-1 < (int)uVar1) {
      set.fds_bits[uVar1 >> 6] = set.fds_bits[uVar1 >> 6] | 1L << ((byte)uVar1 & 0x3f);
      if (iVar3 <= (int)uVar1) {
        iVar3 = uVar1 + 1;
      }
    }
  }
  interrupted_ = 0;
  iVar3 = pselect(iVar3,(fd_set *)&set,(fd_set *)0x0,(fd_set *)0x0,(timespec *)0x0,
                  (__sigset_t *)&this->old_mask_);
  if (iVar3 == -1) {
    piVar6 = __errno_location();
    if (*piVar6 != 4) {
      perror("ninja: pselect");
      return false;
    }
  }
  else {
    HandlePendingInterruption();
    if (interrupted_ != 0) {
      return true;
    }
    __position._M_current =
         (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    while (__position._M_current !=
           (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
           super__Vector_impl_data._M_finish) {
      uVar1 = (*__position._M_current)->fd_;
      if ((((int)uVar1 < 0) || (((ulong)set.fds_bits[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) == 0)
          ) || (Subprocess::OnPipeReady(*__position._M_current), (*__position._M_current)->fd_ != -1
               )) {
        __position._M_current = __position._M_current + 1;
      }
      else {
        std::deque<Subprocess_*,_std::allocator<Subprocess_*>_>::push_back
                  (&(this->finished_).c,__position._M_current);
        __position = std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>::erase
                               (&this->running_,__position._M_current);
      }
    }
  }
  return interrupted_ != 0;
}

Assistant:

bool SubprocessSet::DoWork() {
  fd_set set;
  int nfds = 0;
  FD_ZERO(&set);

  for (vector<Subprocess*>::iterator i = running_.begin();
       i != running_.end(); ++i) {
    int fd = (*i)->fd_;
    if (fd >= 0) {
      FD_SET(fd, &set);
      if (nfds < fd+1)
        nfds = fd+1;
    }
  }

  interrupted_ = 0;
  int ret = pselect(nfds, &set, 0, 0, 0, &old_mask_);
  if (ret == -1) {
    if (errno != EINTR) {
      perror("ninja: pselect");
      return false;
    }
    return IsInterrupted();
  }

  HandlePendingInterruption();
  if (IsInterrupted())
    return true;

  for (vector<Subprocess*>::iterator i = running_.begin();
       i != running_.end(); ) {
    int fd = (*i)->fd_;
    if (fd >= 0 && FD_ISSET(fd, &set)) {
      (*i)->OnPipeReady();
      if ((*i)->Done()) {
        finished_.push(*i);
        i = running_.erase(i);
        continue;
      }
    }
    ++i;
  }

  return IsInterrupted();
}